

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

void ghash_final(ghash_ctx *ctx,uint8_t *out)

{
  ulong uVar1;
  uint8_t lenbuf [8];
  
  if (ctx->state - 1 < 2) {
    ghash_add_pad(ctx);
    ctx->state = 0;
  }
  uVar1 = ctx->len_aad << 3;
  lenbuf = (uint8_t  [8])
           (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | ctx->len_aad << 0x3b);
  ghash_add(ctx,lenbuf,8);
  uVar1 = ctx->len_cipher << 3;
  lenbuf = (uint8_t  [8])
           (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | ctx->len_cipher << 0x3b);
  ghash_add(ctx,lenbuf,8);
  if (ctx->buffer_used == 0) {
    cf_gf128_tobytes_be(ctx->Y,out);
    return;
  }
  abort();
}

Assistant:

static void ghash_final(ghash_ctx *ctx, uint8_t out[16])
{
  uint8_t lenbuf[8];

  if (ctx->state == STATE_AAD || ctx->state == STATE_CIPHER)
  {
    ghash_add_pad(ctx);
    ctx->state = STATE_INVALID;
  }

  /* Add len(A) || len(C) */
  write64_be(ctx->len_aad * 8, lenbuf);
  ghash_add(ctx, lenbuf, sizeof lenbuf);

  write64_be(ctx->len_cipher * 8, lenbuf);
  ghash_add(ctx, lenbuf, sizeof lenbuf);

  assert(ctx->buffer_used == 0);
  cf_gf128_tobytes_be(ctx->Y, out);
}